

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Environmental_Process_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Environmental_Process_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pKVar5;
  char cVar6;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"-Environmental Process PDU-\n");
  poVar3 = std::operator<<(poVar2,"Environmental Process ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_EnvProcID);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar2 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar2,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_3a0._M_string_length <= uVar4) break;
    cVar6 = local_3a0._M_dataplus._M_p[uVar4];
    if (local_3a0._M_string_length - 1 != uVar4 && cVar6 == '\n') {
      cVar6 = '\t';
      std::operator<<(poVar2,'\n');
    }
    std::operator<<(poVar2,cVar6);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar2 = std::operator<<(poVar3,local_380);
  poVar2 = std::operator<<(poVar2,"Environment Type: ");
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_((KString *)local_340,&this->m_EnvType);
  poVar2 = std::operator<<(poVar2,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"Model Type:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ModelType);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Environment Status:\n");
  poVar2 = std::operator<<(poVar2,"\tLast PDU: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8EnvStatus & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tActive: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8EnvStatus >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Environment Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumEnvRec);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Sequence Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SeqNum);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_360);
  pKVar1 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar5 = (this->m_vEnvRecords).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar5 != pKVar1; pKVar5 = pKVar5 + 1) {
    (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Environmental_Process_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Environmental Process PDU-\n"
       << "Environmental Process ID:\n"
       << IndentString( m_EnvProcID.GetAsString(), 1 )
       << "Environment Type: "             << m_EnvType.GetAsString()
       << "Model Type:       "             << ( KUINT16 )m_ui8ModelType     << "\n"
       << "Environment Status:\n"
       << "\tLast PDU: "                   << ( KUINT16 )m_ui8EnvStatusBit0 << "\n"
       << "\tActive: "                     << ( KUINT16 )m_ui8EnvStatusBit1 << "\n"
       << "Number Of Environment Records: " << m_ui16NumEnvRec              << "\n"
       << "Sequence Number: "              << m_ui16SeqNum                  << "\n";

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}